

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O2

void hputs(char *hstring,char *keyword,char *cval)

{
  int iVar1;
  size_t sVar2;
  char value [70];
  
  sVar2 = strlen(cval);
  iVar1 = 0x43;
  if ((int)sVar2 < 0x43) {
    iVar1 = (int)sVar2;
  }
  value[0] = '\'';
  strncpy(value + 1,cval,(long)iVar1);
  (value + (long)iVar1 + 1)[0] = '\'';
  (value + (long)iVar1 + 1)[1] = '\0';
  hputc(hstring,keyword,value);
  return;
}

Assistant:

static void
hputs (hstring,keyword,cval)

char *hstring;	/* FITS header */
char *keyword;	/* Keyword name */
char *cval;	/* character string containing the value for variable
		   keyword.  trailing and leading blanks are removed.  */
{
    char squot = 39;
    char value[70];
    int lcval;

    /*  find length of variable string */

    lcval = strlen (cval);
    if (lcval > 67)
	lcval = 67;

    /* Put quotes around string */
    value[0] = squot;
    strncpy (&value[1],cval,lcval);
    value[lcval+1] = squot;
    value[lcval+2] = 0;

    /* Put value into header string */
    hputc (hstring,keyword,value);

    /* Return to calling program */
    return;
}